

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

double google::protobuf::internal::NoLocaleStrtod(char *str,char **endptr)

{
  char *pcVar1;
  int iVar2;
  LogMessage *pLVar3;
  size_t sVar4;
  string localized;
  char *localized_endptr;
  char *temp_endptr;
  char *local_118;
  ulong local_110;
  char local_108;
  undefined7 uStack_107;
  char acStack_f9 [2];
  undefined8 uStack_f7;
  double local_e8;
  char *local_e0;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_e8 = strtod(str,&local_e0);
  if (endptr != (char **)0x0) {
    *endptr = local_e0;
  }
  if (*local_e0 == '.') {
    iVar2 = snprintf((char *)((long)acStack_f9 + 1),0x10,"%.1f",0x3ff8000000000000);
    if (acStack_f9[1] != '1') {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_FATAL,
                 "third_party/sentencepiece/third_party/protobuf-lite/strutil.cc",0x979);
      pLVar3 = LogMessage::operator<<(&local_68,"CHECK failed: (temp[0]) == (\'1\'): ");
      LogFinisher::operator=((LogFinisher *)&local_d8,pLVar3);
      LogMessage::~LogMessage(&local_68);
    }
    if (acStack_f9[iVar2] != '5') {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_FATAL,
                 "third_party/sentencepiece/third_party/protobuf-lite/strutil.cc",0x97a);
      pLVar3 = LogMessage::operator<<(&local_d8,"CHECK failed: (temp[size - 1]) == (\'5\'): ");
      LogFinisher::operator=((LogFinisher *)&local_a0,pLVar3);
      LogMessage::~LogMessage(&local_d8);
    }
    if (6 < iVar2) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_FATAL,
                 "third_party/sentencepiece/third_party/protobuf-lite/strutil.cc",0x97b);
      pLVar3 = LogMessage::operator<<(&local_a0,"CHECK failed: (size) <= (6): ");
      LogFinisher::operator=((LogFinisher *)&local_118,pLVar3);
      LogMessage::~LogMessage(&local_a0);
    }
    local_118 = &local_108;
    local_110 = 0;
    local_108 = '\0';
    strlen(str);
    std::__cxx11::string::reserve((ulong)&local_118);
    std::__cxx11::string::replace((ulong)&local_118,local_110,(char *)0x0,(ulong)str);
    std::__cxx11::string::append((char *)&local_118,(ulong)&uStack_f7);
    std::__cxx11::string::append((char *)&local_118);
    pcVar1 = local_118;
    local_e8 = strtod(local_118,(char **)((long)acStack_f9 + 1));
    if ((endptr != (char **)0x0) &&
       ((long)local_e0 - (long)str < CONCAT71((undefined7)uStack_f7,acStack_f9[1]) - (long)pcVar1))
    {
      iVar2 = (int)local_110;
      sVar4 = strlen(str);
      *endptr = str + (CONCAT71((undefined7)uStack_f7,acStack_f9[1]) -
                      (long)(pcVar1 + (iVar2 - (int)sVar4)));
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
    }
  }
  return local_e8;
}

Assistant:

double NoLocaleStrtod(const char *str, char **endptr) {
  // We cannot simply set the locale to "C" temporarily with setlocale()
  // as this is not thread-safe.  Instead, we try to parse in the current
  // locale first.  If parsing stops at a '.' character, then this is a
  // pretty good hint that we're actually in some other locale in which
  // '.' is not the radix character.

  char *temp_endptr;
  double result = strtod(str, &temp_endptr);
  if (endptr != NULL) *endptr = temp_endptr;
  if (*temp_endptr != '.') return result;

  // Parsing halted on a '.'.  Perhaps we're in a different locale?  Let's
  // try to replace the '.' with a locale-specific radix character and
  // try again.
  std::string localized = LocalizeRadix(str, temp_endptr);
  const char *localized_cstr = localized.c_str();
  char *localized_endptr;
  result = strtod(localized_cstr, &localized_endptr);
  if ((localized_endptr - localized_cstr) > (temp_endptr - str)) {
    // This attempt got further, so replacing the decimal must have helped.
    // Update endptr to point at the right location.
    if (endptr != NULL) {
      // size_diff is non-zero if the localized radix has multiple bytes.
      int size_diff = localized.size() - strlen(str);
      // const_cast is necessary to match the strtod() interface.
      *endptr = const_cast<char *>(
          str + (localized_endptr - localized_cstr - size_diff));
    }
  }

  return result;
}